

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  long *plVar5;
  pointer *__ptr;
  duration<long,_std::ratio<1L,_1000L>_> local_368;
  AudioLogger audioLogger;
  thread keyReader;
  size_t totalSize_bytes;
  time_point tEnd;
  time_point tStart;
  Callback cbAudio;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  deque<int,_std::allocator<int>_> keyPressedQueue;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> nTimes;
  Parameters parameters;
  ofstream fout;
  
  printf("Usage: %s output.kbd [-cN]\n",*argv);
  puts("    -cN - select capture device N");
  puts("    -CN - number N of capture channels N");
  putchar(10);
  if (argc < 2) {
    iVar2 = -0x7f;
  }
  else {
    parseCmdArguments_abi_cxx11_(&argm,argc,argv);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"c",(allocator<char> *)&parameters);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&fout);
    iVar2 = 0;
    if (pmVar4->_M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keyPressedQueue,"c",(allocator<char> *)&nTimes);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&argm,(key_type *)&keyPressedQueue);
      iVar2 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&keyPressedQueue);
    }
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"C",(allocator<char> *)&parameters);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&fout);
    iVar3 = 0;
    if (pmVar4->_M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keyPressedQueue,"C",(allocator<char> *)&nTimes);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&argm,(key_type *)&keyPressedQueue);
      iVar3 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&keyPressedQueue);
    }
    std::__cxx11::string::~string((string *)&fout);
    tStart.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    tEnd.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    totalSize_bytes = 0;
    std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
              (&keyPressedQueue.super__Deque_base<int,_std::allocator<int>_>);
    nTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &nTimes._M_t._M_impl.super__Rb_tree_header._M_header;
    nTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    nTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    nTimes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    nTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         nTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    printf("Recording %d frames per key press\n",0xb);
    std::ofstream::ofstream(&fout,argv[1],_S_bin);
    std::ostream::write((char *)&fout,0x11e01c);
    AudioLogger::AudioLogger(&audioLogger);
    cbAudio.super__Function_base._M_manager = (_Manager_type)0x0;
    cbAudio._M_invoker = (_Invoker_type)0x0;
    cbAudio.super__Function_base._M_functor = (_Any_data)0x0;
    plVar5 = (long *)operator_new(0x28);
    *plVar5 = (long)&tEnd;
    plVar5[1] = (long)&keyPressedQueue.super__Deque_base<int,_std::allocator<int>_>;
    plVar5[2] = (long)&fout;
    plVar5[3] = (long)&totalSize_bytes;
    plVar5[4] = (long)&nTimes;
    cbAudio.super__Function_base._M_functor._M_unused._M_object = plVar5;
    cbAudio._M_invoker =
         std::
         _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
         ::_M_invoke;
    cbAudio.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
         ::_M_manager;
    parameters.callback.super__Function_base._M_manager = (_Manager_type)0x0;
    parameters.callback._M_invoker = (_Invoker_type)0x0;
    parameters.callback.super__Function_base._M_functor = (_Any_data)0x0;
    parameters.captureId = -1;
    parameters.nChannels = -1;
    parameters.sampleRate = -1;
    parameters.sampleType = F32SYS;
    parameters.filter = FirstOrderHighPass;
    parameters.freqCutoff_Hz = 1000.0;
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::operator=(&parameters.callback,&cbAudio);
    parameters.sampleRate = 16000;
    parameters.freqCutoff_Hz = 100.0;
    parameters.captureId = iVar2;
    parameters.nChannels = iVar3;
    bVar1 = AudioLogger::install(&audioLogger,&parameters);
    if (bVar1) {
      putchar(10);
      puts("To stop capturing press Ctrl+C");
      puts(
          "On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually"
          );
      putchar(10);
      keyReader._M_id._M_thread = (id)0;
      local_368.__r = (rep)operator_new(0x20);
      *(undefined ***)local_368.__r = &PTR___State_00126c98;
      *(time_point **)(local_368.__r + 8) = &tStart;
      *(_Deque_base<int,_std::allocator<int>_> **)(local_368.__r + 0x10) =
           &keyPressedQueue.super__Deque_base<int,_std::allocator<int>_>;
      *(AudioLogger **)(local_368.__r + 0x18) = &audioLogger;
      std::thread::_M_start_thread(&keyReader,&local_368,0);
      if ((long *)local_368.__r != (long *)0x0) {
        (**(code **)(*(long *)local_368.__r + 8))();
      }
      do {
        local_368.__r = 100;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_368);
      } while( true );
    }
    fwrite("Failed to install audio logger\n",0x1f,1,_stderr);
    std::_Function_base::~_Function_base((_Function_base *)&parameters);
    std::_Function_base::~_Function_base(&cbAudio.super__Function_base);
    AudioLogger::~AudioLogger(&audioLogger);
    std::ofstream::~ofstream(&fout);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&nTimes._M_t);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&keyPressedQueue.super__Deque_base<int,_std::allocator<int>_>);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&argm._M_t);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    auto tStart = std::chrono::high_resolution_clock::now();
    auto tEnd = std::chrono::high_resolution_clock::now();

    size_t totalSize_bytes = 0;
    std::deque<int> keyPressedQueue;
    std::map<int, int> nTimes;
    printf("Recording %d frames per key press\n", kBufferSizeTrain_frames);

    std::ofstream fout(argv[1], std::ios::binary);
    fout.write((char *)(&kBufferSizeTrain_frames), sizeof(kBufferSizeTrain_frames));

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        tEnd = std::chrono::high_resolution_clock::now();

        int keyPressed = keyPressedQueue.front();
        keyPressedQueue.pop_front();

        fout.write((char *)(&keyPressed), sizeof(keyPressed));
        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }
        ++nTimes[keyPressed];

        printf("Last recorded key - %3d '%s'. Total times recorded so far - %3d. Total data saved: %g MB\n",
               keyPressed, kKeyText.at(keyPressed), nTimes[keyPressed], ((float)(totalSize_bytes)/1024.0f/1024.0f));

        keyPressed = -1;
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    printf("\n");
    printf("To stop capturing press Ctrl+C\n");
    printf("On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually\n");
    printf("\n");

    std::thread keyReader = std::thread([&]() {
        struct termios oldt, newt;
        tcgetattr ( STDIN_FILENO, &oldt );
        newt = oldt;
        newt.c_lflag &= ~( ICANON | ECHO );
        tcsetattr ( STDIN_FILENO, TCSANOW, &newt );
        while (true) {
            int key = getchar();
            tStart = std::chrono::high_resolution_clock::now();
            keyPressedQueue.push_back(key);
            if (audioLogger.record(kBufferSizeTrain_s, 2) == false) {
                fprintf(stderr, "error : failed to record\n");
            }
        }
        tcsetattr ( STDIN_FILENO, TCSANOW, &oldt );
    });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }

    keyReader.join();

    fout.close();

    return 0;
}